

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void statPush(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  tRowcnt *ptVar1;
  uint *puVar2;
  uint uVar3;
  tRowcnt *ptVar4;
  tRowcnt *ptVar5;
  tRowcnt *ptVar6;
  sqlite3_value *pMem;
  sqlite3 *db;
  int iVar7;
  u32 uVar8;
  Stat4Accum *p;
  i64 iVar9;
  u8 *puVar10;
  Stat4Sample *pSVar11;
  ulong uVar12;
  Stat4Sample *pNew;
  long lVar13;
  long lVar14;
  long lVar15;
  uint iChng;
  
  p = (Stat4Accum *)sqlite3_value_blob(*argv);
  iVar9 = sqlite3VdbeIntValue(argv[1]);
  iChng = (uint)iVar9;
  if (p->nRow == 0) {
    if (0 < p->nCol) {
      ptVar4 = (p->current).anEq;
      lVar13 = 0;
      do {
        ptVar4[lVar13] = 1;
        lVar13 = lVar13 + 1;
      } while (lVar13 < p->nCol);
    }
  }
  else {
    samplePushPrevious(p,iChng);
    if (0 < (int)iChng) {
      ptVar4 = (p->current).anEq;
      uVar12 = 0;
      do {
        ptVar5 = ptVar4 + uVar12;
        *ptVar5 = *ptVar5 + 1;
        uVar12 = uVar12 + 1;
      } while ((iChng & 0x7fffffff) != uVar12);
    }
    if ((int)iChng < p->nCol) {
      ptVar4 = (p->current).anEq;
      ptVar5 = (p->current).anDLt;
      ptVar6 = (p->current).anLt;
      lVar13 = (long)(int)iChng;
      do {
        ptVar1 = ptVar5 + lVar13;
        *ptVar1 = *ptVar1 + 1;
        ptVar1 = ptVar6 + lVar13;
        *ptVar1 = *ptVar1 + ptVar4[lVar13];
        ptVar4[lVar13] = 1;
        lVar13 = lVar13 + 1;
      } while (lVar13 < p->nCol);
    }
  }
  p->nRow = p->nRow + 1;
  pMem = argv[2];
  uVar3._0_2_ = pMem->flags;
  uVar3._2_1_ = pMem->enc;
  uVar3._3_1_ = pMem->eSubtype;
  db = p->db;
  if ((0x50505050U >> (uVar3 & 0x1f) & 1) == 0) {
    iVar7 = sqlite3ValueBytes(pMem,'\x01');
    puVar10 = (u8 *)sqlite3_value_blob(argv[2]);
    sampleSetRowid(db,&p->current,iVar7,puVar10);
  }
  else {
    iVar9 = sqlite3VdbeIntValue(pMem);
    if (((p->current).nRowid != 0) && (puVar10 = (p->current).u.aRowid, puVar10 != (u8 *)0x0)) {
      sqlite3DbFreeNN(db,puVar10);
    }
    (p->current).nRowid = 0;
    (p->current).u.iRowid = iVar9;
  }
  uVar8 = p->iPrn * 0x41c64e6d + 0x3039;
  p->iPrn = uVar8;
  pNew = &p->current;
  (p->current).iHash = uVar8;
  iVar7 = p->nCol;
  uVar12 = (ulong)iVar7;
  uVar3 = (p->current).anLt[uVar12 - 1];
  if (uVar3 / p->nPSample != (uVar3 + 1) / p->nPSample) {
    (p->current).isPSample = '\x01';
    (p->current).iCol = 0;
    sampleInsert(p,pNew,iVar7 + -1);
    (p->current).isPSample = '\0';
    uVar12 = (ulong)(uint)p->nCol;
  }
  if (1 < (int)uVar12) {
    lVar13 = 1;
    lVar15 = 0;
    do {
      (p->current).iCol = (int)lVar15;
      if (lVar15 < (int)iChng) {
        pSVar11 = p->aBest + lVar15;
        lVar14 = lVar13;
        do {
          if ((int)uVar12 <= lVar14) {
            if (pSVar11->iHash < (p->current).iHash) goto LAB_00195253;
            break;
          }
          puVar2 = pNew->anEq + lVar14;
          uVar3 = pSVar11->anEq[lVar14];
          if (uVar3 < *puVar2) goto LAB_00195253;
          lVar14 = lVar14 + 1;
        } while (uVar3 <= *puVar2);
      }
      else {
LAB_00195253:
        sampleCopy(p,p->aBest + lVar15,pNew);
        uVar12 = (ulong)(uint)p->nCol;
      }
      lVar15 = lVar15 + 1;
      lVar13 = lVar13 + 1;
    } while (lVar15 < (int)uVar12 + -1);
  }
  return;
}

Assistant:

static void statPush(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i;

  /* The three function arguments */
  Stat4Accum *p = (Stat4Accum*)sqlite3_value_blob(argv[0]);
  int iChng = sqlite3_value_int(argv[1]);

  UNUSED_PARAMETER( argc );
  UNUSED_PARAMETER( context );
  assert( p->nCol>0 );
  assert( iChng<p->nCol );

  if( p->nRow==0 ){
    /* This is the first call to this function. Do initialization. */
    for(i=0; i<p->nCol; i++) p->current.anEq[i] = 1;
  }else{
    /* Second and subsequent calls get processed here */
    samplePushPrevious(p, iChng);

    /* Update anDLt[], anLt[] and anEq[] to reflect the values that apply
    ** to the current row of the index. */
    for(i=0; i<iChng; i++){
      p->current.anEq[i]++;
    }
    for(i=iChng; i<p->nCol; i++){
      p->current.anDLt[i]++;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
      p->current.anLt[i] += p->current.anEq[i];
#endif
      p->current.anEq[i] = 1;
    }
  }
  p->nRow++;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( sqlite3_value_type(argv[2])==SQLITE_INTEGER ){
    sampleSetRowidInt64(p->db, &p->current, sqlite3_value_int64(argv[2]));
  }else{
    sampleSetRowid(p->db, &p->current, sqlite3_value_bytes(argv[2]),
                                       sqlite3_value_blob(argv[2]));
  }
  p->current.iHash = p->iPrn = p->iPrn*1103515245 + 12345;
#endif

#ifdef SQLITE_ENABLE_STAT4
  {
    tRowcnt nLt = p->current.anLt[p->nCol-1];

    /* Check if this is to be a periodic sample. If so, add it. */
    if( (nLt/p->nPSample)!=(nLt+1)/p->nPSample ){
      p->current.isPSample = 1;
      p->current.iCol = 0;
      sampleInsert(p, &p->current, p->nCol-1);
      p->current.isPSample = 0;
    }

    /* Update the aBest[] array. */
    for(i=0; i<(p->nCol-1); i++){
      p->current.iCol = i;
      if( i>=iChng || sampleIsBetterPost(p, &p->current, &p->aBest[i]) ){
        sampleCopy(p, &p->aBest[i], &p->current);
      }
    }
  }
#endif
}